

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

xmlChar * xmlParseEncodingDecl(xmlParserCtxtPtr ctxt)

{
  xmlChar xVar1;
  xmlParserInputBufferPtr pxVar2;
  int iVar3;
  xmlChar *pxVar4;
  xmlParserInputPtr pxVar5;
  xmlCharEncodingHandlerPtr handler;
  xmlChar *pxVar6;
  
  xmlSkipBlankChars(ctxt);
  pxVar5 = ctxt->input;
  pxVar4 = pxVar5->cur;
  if (*pxVar4 != 'e') {
    return (xmlChar *)0x0;
  }
  if (pxVar4[1] != 'n') {
    return (xmlChar *)0x0;
  }
  if (pxVar4[2] != 'c') {
    return (xmlChar *)0x0;
  }
  if (pxVar4[3] != 'o') {
    return (xmlChar *)0x0;
  }
  if (pxVar4[4] != 'd') {
    return (xmlChar *)0x0;
  }
  if (pxVar4[5] != 'i') {
    return (xmlChar *)0x0;
  }
  if (pxVar4[6] != 'n') {
    return (xmlChar *)0x0;
  }
  if (pxVar4[7] != 'g') {
    return (xmlChar *)0x0;
  }
  pxVar5->cur = pxVar4 + 8;
  pxVar5->col = pxVar5->col + 8;
  if (pxVar4[8] == '\0') {
    xmlParserInputGrow(pxVar5,0xfa);
  }
  xmlSkipBlankChars(ctxt);
  if (*ctxt->input->cur != '=') {
    xmlFatalErr(ctxt,XML_ERR_EQUAL_REQUIRED,(char *)0x0);
    return (xmlChar *)0x0;
  }
  xmlNextChar(ctxt);
  xmlSkipBlankChars(ctxt);
  xVar1 = *ctxt->input->cur;
  if (xVar1 == '\'') {
    xmlNextChar(ctxt);
    pxVar4 = xmlParseEncName(ctxt);
    if (*ctxt->input->cur != '\'') {
LAB_0015c800:
      xmlFatalErr(ctxt,XML_ERR_STRING_NOT_CLOSED,(char *)0x0);
      goto LAB_0015c8da;
    }
LAB_0015c7c1:
    xmlNextChar(ctxt);
  }
  else {
    if (xVar1 == '\"') {
      xmlNextChar(ctxt);
      pxVar4 = xmlParseEncName(ctxt);
      if (*ctxt->input->cur != '\"') goto LAB_0015c800;
      goto LAB_0015c7c1;
    }
    pxVar4 = (xmlChar *)0x0;
    xmlFatalErr(ctxt,XML_ERR_STRING_NOT_STARTED,(char *)0x0);
  }
  if ((ctxt->options & 0x200000) != 0) {
LAB_0015c8da:
    (*xmlFree)(pxVar4);
    return (xmlChar *)0x0;
  }
  if (pxVar4 == (xmlChar *)0x0) {
    return (xmlChar *)0x0;
  }
  iVar3 = xmlStrcasecmp(pxVar4,(xmlChar *)"UTF-16");
  if ((iVar3 == 0) || (iVar3 = xmlStrcasecmp(pxVar4,(xmlChar *)"UTF16"), iVar3 == 0)) {
    pxVar6 = ctxt->encoding;
    if (pxVar6 == (xmlChar *)0x0) {
      pxVar2 = ctxt->input->buf;
      if ((pxVar2 == (xmlParserInputBufferPtr)0x0) ||
         (pxVar2->encoder != (xmlCharEncodingHandlerPtr)0x0)) goto LAB_0015c934;
      xmlFatalErrMsg(ctxt,XML_ERR_INVALID_ENCODING,
                     "Document labelled UTF-16 but has UTF-8 content\n");
      goto LAB_0015c922;
    }
  }
  else {
    iVar3 = xmlStrcasecmp(pxVar4,"UTF-8");
    if ((iVar3 != 0) && (iVar3 = xmlStrcasecmp(pxVar4,(xmlChar *)"UTF8"), iVar3 != 0)) {
      pxVar5 = ctxt->input;
      if (pxVar5->encoding != (xmlChar *)0x0) {
        (*xmlFree)(pxVar5->encoding);
        pxVar5 = ctxt->input;
      }
      pxVar5->encoding = pxVar4;
      handler = xmlFindCharEncodingHandler((char *)pxVar4);
      if (handler != (xmlCharEncodingHandlerPtr)0x0) {
        iVar3 = xmlSwitchToEncoding(ctxt,handler);
        if (iVar3 < 0) {
          ctxt->errNo = 0x20;
          return (xmlChar *)0x0;
        }
        return pxVar4;
      }
      xmlFatalErrMsgStr(ctxt,XML_ERR_UNSUPPORTED_ENCODING,"Unsupported encoding %s\n",pxVar4);
      return (xmlChar *)0x0;
    }
LAB_0015c922:
    pxVar6 = ctxt->encoding;
    if (pxVar6 == (xmlChar *)0x0) goto LAB_0015c934;
  }
  (*xmlFree)(pxVar6);
LAB_0015c934:
  ctxt->encoding = pxVar4;
  return pxVar4;
}

Assistant:

const xmlChar *
xmlParseEncodingDecl(xmlParserCtxtPtr ctxt) {
    xmlChar *encoding = NULL;

    SKIP_BLANKS;
    if (CMP8(CUR_PTR, 'e', 'n', 'c', 'o', 'd', 'i', 'n', 'g')) {
	SKIP(8);
	SKIP_BLANKS;
	if (RAW != '=') {
	    xmlFatalErr(ctxt, XML_ERR_EQUAL_REQUIRED, NULL);
	    return(NULL);
        }
	NEXT;
	SKIP_BLANKS;
	if (RAW == '"') {
	    NEXT;
	    encoding = xmlParseEncName(ctxt);
	    if (RAW != '"') {
		xmlFatalErr(ctxt, XML_ERR_STRING_NOT_CLOSED, NULL);
		xmlFree((xmlChar *) encoding);
		return(NULL);
	    } else
	        NEXT;
	} else if (RAW == '\''){
	    NEXT;
	    encoding = xmlParseEncName(ctxt);
	    if (RAW != '\'') {
		xmlFatalErr(ctxt, XML_ERR_STRING_NOT_CLOSED, NULL);
		xmlFree((xmlChar *) encoding);
		return(NULL);
	    } else
	        NEXT;
	} else {
	    xmlFatalErr(ctxt, XML_ERR_STRING_NOT_STARTED, NULL);
	}

        /*
         * Non standard parsing, allowing the user to ignore encoding
         */
        if (ctxt->options & XML_PARSE_IGNORE_ENC) {
	    xmlFree((xmlChar *) encoding);
            return(NULL);
	}

	/*
	 * UTF-16 encoding switch has already taken place at this stage,
	 * more over the little-endian/big-endian selection is already done
	 */
        if ((encoding != NULL) &&
	    ((!xmlStrcasecmp(encoding, BAD_CAST "UTF-16")) ||
	     (!xmlStrcasecmp(encoding, BAD_CAST "UTF16")))) {
	    /*
	     * If no encoding was passed to the parser, that we are
	     * using UTF-16 and no decoder is present i.e. the
	     * document is apparently UTF-8 compatible, then raise an
	     * encoding mismatch fatal error
	     */
	    if ((ctxt->encoding == NULL) &&
	        (ctxt->input->buf != NULL) &&
	        (ctxt->input->buf->encoder == NULL)) {
		xmlFatalErrMsg(ctxt, XML_ERR_INVALID_ENCODING,
		  "Document labelled UTF-16 but has UTF-8 content\n");
	    }
	    if (ctxt->encoding != NULL)
		xmlFree((xmlChar *) ctxt->encoding);
	    ctxt->encoding = encoding;
	}
	/*
	 * UTF-8 encoding is handled natively
	 */
        else if ((encoding != NULL) &&
	    ((!xmlStrcasecmp(encoding, BAD_CAST "UTF-8")) ||
	     (!xmlStrcasecmp(encoding, BAD_CAST "UTF8")))) {
	    if (ctxt->encoding != NULL)
		xmlFree((xmlChar *) ctxt->encoding);
	    ctxt->encoding = encoding;
	}
	else if (encoding != NULL) {
	    xmlCharEncodingHandlerPtr handler;

	    if (ctxt->input->encoding != NULL)
		xmlFree((xmlChar *) ctxt->input->encoding);
	    ctxt->input->encoding = encoding;

            handler = xmlFindCharEncodingHandler((const char *) encoding);
	    if (handler != NULL) {
		if (xmlSwitchToEncoding(ctxt, handler) < 0) {
		    /* failed to convert */
		    ctxt->errNo = XML_ERR_UNSUPPORTED_ENCODING;
		    return(NULL);
		}
	    } else {
		xmlFatalErrMsgStr(ctxt, XML_ERR_UNSUPPORTED_ENCODING,
			"Unsupported encoding %s\n", encoding);
		return(NULL);
	    }
	}
    }
    return(encoding);
}